

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

size_t showShortOptions(poptOption *opt,FILE *fp,char *str)

{
  char cVar1;
  char *pcVar2;
  ushort **ppuVar3;
  size_t sVar4;
  bool bVar5;
  char *local_50;
  poptOption *local_48;
  void *arg;
  size_t len;
  char *s;
  size_t nb;
  char *str_local;
  FILE *fp_local;
  poptOption *opt_local;
  
  local_50 = str;
  if (str == (char *)0x0) {
    local_50 = (char *)calloc(1,300);
  }
  arg = (void *)0x0;
  if (local_50 == (char *)0x0) {
    opt_local = (poptOption *)0x0;
  }
  else {
    fp_local = (FILE *)opt;
    if (opt != (poptOption *)0x0) {
      while( true ) {
        bVar5 = true;
        if ((*(long *)fp_local == 0) && (bVar5 = true, *(char *)&fp_local->_IO_read_ptr == '\0')) {
          bVar5 = fp_local->_IO_read_end != (char *)0x0;
        }
        if (!bVar5) break;
        if (((((ulong)fp_local->_IO_read_ptr & 0x4000000000000000) == 0) &&
            (*(char *)&fp_local->_IO_read_ptr != '\0')) &&
           ((*(uint *)((long)&fp_local->_IO_read_ptr + 4) & _poptArgMask) == 0)) {
          pcVar2 = strchr(local_50,(int)*(char *)&fp_local->_IO_read_ptr);
          if (((pcVar2 == (char *)0x0) &&
              (ppuVar3 = __ctype_b_loc(),
              ((*ppuVar3)[(int)*(char *)&fp_local->_IO_read_ptr] & 0x4000) != 0)) &&
             (*(char *)&fp_local->_IO_read_ptr != ' ')) {
            cVar1 = *(char *)&fp_local->_IO_read_ptr;
            sVar4 = strlen(local_50);
            local_50[sVar4] = cVar1;
          }
        }
        else if ((*(uint *)((long)&fp_local->_IO_read_ptr + 4) & _poptArgMask) == 4) {
          local_48 = (poptOption *)fp_local->_IO_read_end;
          if (local_48 == poptHelpOptions) {
            local_48 = poptHelpOptionsI18N;
          }
          if (local_48 != (poptOption *)0x0) {
            arg = (void *)showShortOptions(local_48,fp,local_50);
          }
        }
        fp_local = (FILE *)&fp_local->_IO_write_end;
      }
    }
    if ((local_50 != str) && (*local_50 != '\0')) {
      fprintf((FILE *)fp," [-%s]",local_50);
      sVar4 = strlen(local_50);
      arg = (void *)(sVar4 + 4);
    }
    if (local_50 != str) {
      free(local_50);
    }
    opt_local = (poptOption *)arg;
  }
  return (size_t)opt_local;
}

Assistant:

static size_t showShortOptions(const struct poptOption * opt, FILE * fp,
		char * str)
{
    /* bufsize larger then the ascii set, lazy allocation on top level call. */
    size_t nb = (size_t)300;
    char * s = (str != NULL ? str : calloc((size_t)1, nb));
    size_t len = (size_t)0;

    if (s == NULL)
	return 0;

    if (opt != NULL)
    for (; (opt->longName || opt->shortName || opt->arg); opt++) {
	if (!F_ISSET(opt, DOC_HIDDEN) && opt->shortName && !poptArgType(opt))
	{
	    /* Display shortName iff unique printable non-space. */
	    if (!strchr(s, opt->shortName) && isprint((int)opt->shortName)
	     && opt->shortName != ' ')
		s[strlen(s)] = opt->shortName;
	} else if (poptArgType(opt) == POPT_ARG_INCLUDE_TABLE) {
	    void * arg = opt->arg;
	    /* XXX sick hack to preserve pretense of ABI. */
	    if (arg == poptHelpOptions)
		arg = poptHelpOptionsI18N;
	    if (arg)	/* XXX program error */
		len = showShortOptions(arg, fp, s);
	}
    } 

    /* On return to top level, print the short options, return print length. */
    if (s != str && *s != '\0') {
	fprintf(fp, " [-%s]", s);
	len = strlen(s) + sizeof(" [-]")-1;
    }
    if (s != str)
	free(s);
    return len;
}